

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_write(connectdata *conn,curl_socket_t sockfd,void *mem,size_t len,ssize_t *written)

{
  uint uVar1;
  ssize_t sVar2;
  CURLcode local_44;
  int num;
  CURLcode curlcode;
  ssize_t bytes_written;
  ssize_t *written_local;
  size_t len_local;
  void *mem_local;
  connectdata *pcStack_18;
  curl_socket_t sockfd_local;
  connectdata *conn_local;
  
  local_44 = CURLE_OK;
  uVar1 = (uint)(sockfd == conn->sock[1]);
  bytes_written = (ssize_t)written;
  written_local = (ssize_t *)len;
  len_local = (size_t)mem;
  mem_local._4_4_ = sockfd;
  pcStack_18 = conn;
  sVar2 = (*conn->send[(int)uVar1])(conn,uVar1,mem,len,&local_44);
  *(ssize_t *)bytes_written = sVar2;
  if (sVar2 < 0) {
    if (local_44 == CURLE_OK) {
      conn_local._4_4_ = CURLE_SEND_ERROR;
    }
    else if (local_44 == CURLE_AGAIN) {
      *(undefined8 *)bytes_written = 0;
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      conn_local._4_4_ = local_44;
    }
  }
  else {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_write(struct connectdata *conn,
                    curl_socket_t sockfd,
                    const void *mem,
                    size_t len,
                    ssize_t *written)
{
  ssize_t bytes_written;
  CURLcode curlcode = CURLE_OK;
  int num = (sockfd == conn->sock[SECONDARYSOCKET]);

  bytes_written = conn->send[num](conn, num, mem, len, &curlcode);

  *written = bytes_written;
  if(bytes_written >= 0)
    /* we completely ignore the curlcode value when subzero is not returned */
    return CURLE_OK;

  /* handle CURLE_AGAIN or a send failure */
  switch(curlcode) {
  case CURLE_AGAIN:
    *written = 0;
    return CURLE_OK;

  case CURLE_OK:
    /* general send failure */
    return CURLE_SEND_ERROR;

  default:
    /* we got a specific curlcode, forward it */
    return curlcode;
  }
}